

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O2

vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_> *
testinator::Arbitrary<std::tuple<int,_float>_>::shrink
          (vector<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>
           *__return_storage_ptr__,tuple<int,_float> *t)

{
  tuple<float> *e;
  pointer ptVar1;
  vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_> tail_v;
  vector<int,_std::allocator<int>_> head_v;
  tuple<int,_float> local_68;
  _Vector_base<std::tuple<float>,_std::allocator<std::tuple<float>_>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<int,_float>,_std::allocator<std::tuple<int,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Tuple_impl<0UL,_int,_float>.super__Tuple_impl<1UL,_float>.
  super__Head_base<1UL,_float,_false>._M_head_impl =
       (_Head_base<1UL,_float,_false>)
       (t->super__Tuple_impl<0UL,_int,_float>).super__Tuple_impl<1UL,_float>.
       super__Head_base<1UL,_float,_false>._M_head_impl;
  Arbitrary<std::tuple<float>_>::shrink
            ((vector<std::tuple<float>,_std::allocator<std::tuple<float>_>_> *)&local_60,
             (tuple<float> *)&local_68);
  for (ptVar1 = local_60._M_impl.super__Vector_impl_data._M_start;
      ptVar1 != local_60._M_impl.super__Vector_impl_data._M_finish; ptVar1 = ptVar1 + 1) {
    local_68.super__Tuple_impl<0UL,_int,_float>.super__Tuple_impl<1UL,_float>.
    super__Head_base<1UL,_float,_false>._M_head_impl =
         (_Head_base<1UL,_float,_false>)
         (ptVar1->super__Tuple_impl<0UL,_float>).super__Head_base<0UL,_float,_false>._M_head_impl;
    local_68.super__Tuple_impl<0UL,_int,_float>.super__Head_base<0UL,_int,_false>._M_head_impl =
         (t->super__Tuple_impl<0UL,_int,_float>).super__Head_base<0UL,_int,_false>._M_head_impl;
    ::std::vector<std::tuple<int,float>,std::allocator<std::tuple<int,float>>>::
    emplace_back<std::tuple<int,float>>
              ((vector<std::tuple<int,float>,std::allocator<std::tuple<int,float>>> *)
               __return_storage_ptr__,&local_68);
  }
  ::std::_Vector_base<std::tuple<float>,_std::allocator<std::tuple<float>_>_>::~_Vector_base
            (&local_60);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::tuple<Ts...>> shrink(const std::tuple<Ts...>& t)
    {
      std::vector<std::tuple<Ts...>> ret{};

      // shrink the head
      using H = std::decay_t<decltype(std::get<0>(t))>;
      auto head_v = Arbitrary<H>::shrink(std::get<0>(t));
      for (auto& e : head_v)
      {
        ret.push_back(tuple_cons(std::move(e), tuple_tail(t)));
      }

      // shrink the tail recursively
      using T = std::decay_t<decltype(tuple_tail(t))>;
      auto tail_v = Arbitrary<T>::shrink(tuple_tail(t));
      for (auto& e : tail_v)
      {
        ret.push_back(tuple_cons(std::get<0>(t), std::move(e)));
      }

      return ret;
    }